

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c++
# Opt level: O0

CappedArray<char,_32UL> *
kj::operator*(CappedArray<char,_32UL> *__return_storage_ptr__,long param_2)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  size_t end_00;
  unsigned_long *value;
  ArrayPtr<char> local_198;
  ArrayPtr<const_char> local_188;
  ArrayPtr<char> local_178 [2];
  Fault local_158;
  Fault f;
  DebugExpression<unsigned_long> local_148;
  undefined1 local_140 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  ArrayPtr<char> local_108;
  undefined8 local_f8;
  Quantity<long,_kj::_::NanosecondLabel> local_f0;
  long local_e8;
  char *local_e0;
  char *end;
  char *begin;
  char *local_c8;
  StringPtr local_c0;
  StringPtr local_b0;
  StringPtr local_a0;
  Quantity<long,_kj::_::NanosecondLabel> local_90;
  Duration unit;
  StringPtr suffix;
  size_t point;
  ArrayPtr<char> arr;
  CappedArray<char,_26UL> digits;
  uint64_t ns;
  Quantity<long,_kj::_::NanosecondLabel> local_28;
  byte local_19;
  Quantity<long,_kj::_::NanosecondLabel> QStack_18;
  bool negative;
  Duration d_local;
  
  QStack_18.value = param_2;
  local_28 = operator*<int,_long,_kj::_::NanosecondLabel,_void>
                       (0,(Quantity<long,_kj::_::NanosecondLabel>)0x3b9aca00);
  local_19 = Quantity<long,kj::_::NanosecondLabel>::operator<
                       ((Quantity<long,kj::_::NanosecondLabel> *)&stack0xffffffffffffffe8,&local_28)
  ;
  digits._32_8_ =
       Quantity<long,kj::_::NanosecondLabel>::operator/
                 ((Quantity<long,kj::_::NanosecondLabel> *)&stack0xffffffffffffffe8,
                  (Quantity<long,_kj::_::NanosecondLabel> *)&NANOSECONDS);
  if ((local_19 & 1) != 0) {
    digits._32_8_ = -digits._32_8_;
  }
  toCharSequence<unsigned_long&>
            ((CappedArray<char,_26UL> *)&arr.size_,(kj *)(digits.content + 0x18),value);
  _point = CappedArray::operator_cast_to_ArrayPtr((CappedArray *)&arr.size_);
  StringPtr::StringPtr((StringPtr *)&unit);
  sVar2 = CappedArray<char,_26UL>::size((CappedArray<char,_26UL> *)&arr.size_);
  if (sVar2 < 10) {
    sVar2 = CappedArray<char,_26UL>::size((CappedArray<char,_26UL> *)&arr.size_);
    if (sVar2 < 7) {
      sVar2 = CappedArray<char,_26UL>::size((CappedArray<char,_26UL> *)&arr.size_);
      if (sVar2 < 4) {
        suffix.content.size_ = ArrayPtr<char>::size((ArrayPtr<char> *)&point);
        StringPtr::StringPtr((StringPtr *)&begin,"ns");
        unit.value = (long)begin;
        suffix.content.ptr = local_c8;
        local_90.value = 1;
      }
      else {
        sVar2 = ArrayPtr<char>::size((ArrayPtr<char> *)&point);
        suffix.content.size_ = sVar2 - 3;
        StringPtr::StringPtr(&local_c0,anon_var_dwarf_19fb68);
        unit.value = (long)local_c0.content.ptr;
        suffix.content.ptr = (char *)local_c0.content.size_;
        local_90.value = 1000;
      }
    }
    else {
      sVar2 = ArrayPtr<char>::size((ArrayPtr<char> *)&point);
      suffix.content.size_ = sVar2 - 6;
      StringPtr::StringPtr(&local_b0,"ms");
      unit.value = (long)local_b0.content.ptr;
      suffix.content.ptr = (char *)local_b0.content.size_;
      local_90.value = 1000000;
    }
  }
  else {
    sVar2 = ArrayPtr<char>::size((ArrayPtr<char> *)&point);
    suffix.content.size_ = sVar2 - 9;
    StringPtr::StringPtr(&local_a0,"s");
    unit.value = (long)local_a0.content.ptr;
    suffix.content.ptr = (char *)local_a0.content.size_;
    local_90.value = 1000000000;
  }
  CappedArray<char,_32UL>::CappedArray(__return_storage_ptr__);
  pcVar3 = CappedArray<char,_32UL>::begin(__return_storage_ptr__);
  end = pcVar3;
  if ((local_19 & 1) != 0) {
    end = pcVar3 + 1;
    *pcVar3 = '-';
  }
  local_e8 = (long)Quantity<long,_kj::_::NanosecondLabel>::operator%<long>
                             (&stack0xffffffffffffffe8,&local_90);
  local_f8 = 1;
  local_f0 = operator*<int,_long,_kj::_::NanosecondLabel,_void>
                       (0,(Quantity<long,_kj::_::NanosecondLabel>)0x1);
  bVar1 = Quantity<long,kj::_::NanosecondLabel>::operator==
                    ((Quantity<long,kj::_::NanosecondLabel> *)&local_e8,&local_f0);
  pcVar3 = end;
  if (bVar1) {
    pcVar4 = CappedArray<char,_32UL>::end(__return_storage_ptr__);
    local_108 = ArrayPtr<char>::first((ArrayPtr<char> *)&point,suffix.content.size_);
    local_e0 = _::fillLimited<kj::ArrayPtr<char>,kj::StringPtr&>
                         (pcVar3,pcVar4,&local_108,(StringPtr *)&unit);
  }
  else {
    while (pcVar3 = ArrayPtr<char>::back((ArrayPtr<char> *)&point), *pcVar3 == '0') {
      sVar2 = ArrayPtr<char>::size((ArrayPtr<char> *)&point);
      join_0x00000010_0x00000000_ = ArrayPtr<char>::first((ArrayPtr<char> *)&point,sVar2 - 1);
      _point = join_0x00000010_0x00000000_;
    }
    f.exception = (Exception *)ArrayPtr<char>::size((ArrayPtr<char> *)&point);
    local_148 = _::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&_::MAGIC_ASSERT,(unsigned_long *)&f);
    _::DebugExpression<unsigned_long>::operator>
              ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_140,&local_148,
               &suffix.content.size_);
    bVar1 = _::DebugComparison::operator_cast_to_bool((DebugComparison *)local_140);
    pcVar3 = end;
    if (!bVar1) {
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&>
                (&local_158,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/time.c++"
                 ,0x138,FAILED,"arr.size() > point","_kjCondition,",
                 (DebugComparison<unsigned_long,_unsigned_long_&> *)local_140);
      _::Debug::Fault::fatal(&local_158);
    }
    pcVar4 = CappedArray<char,_32UL>::end(__return_storage_ptr__);
    local_178[0] = ArrayPtr<char>::first((ArrayPtr<char> *)&point,suffix.content.size_);
    local_188 = (ArrayPtr<const_char>)operator____kj(".",1);
    sVar2 = suffix.content.size_;
    end_00 = ArrayPtr<char>::size((ArrayPtr<char> *)&point);
    local_198 = ArrayPtr<char>::slice((ArrayPtr<char> *)&point,sVar2,end_00);
    local_e0 = _::fillLimited<kj::ArrayPtr<char>,kj::StringPtr,kj::ArrayPtr<char>,kj::StringPtr&>
                         (pcVar3,pcVar4,local_178,(StringPtr *)&local_188,&local_198,
                          (StringPtr *)&unit);
  }
  pcVar3 = local_e0;
  pcVar4 = CappedArray<char,_32UL>::begin(__return_storage_ptr__);
  CappedArray<char,_32UL>::setSize(__return_storage_ptr__,(long)pcVar3 - (long)pcVar4);
  return __return_storage_ptr__;
}

Assistant:

CappedArray<char, _::TIME_STR_LEN> KJ_STRINGIFY(Duration d) {
  bool negative = d < 0 * kj::SECONDS;
  uint64_t ns = d / kj::NANOSECONDS;
  if (negative) {
    ns = -ns;
  }

  auto digits = kj::toCharSequence(ns);
  ArrayPtr<char> arr = digits;

  size_t point;
  kj::StringPtr suffix;
  kj::Duration unit;
  if (digits.size() > 9) {
    point = arr.size() - 9;
    suffix = "s";
    unit = kj::SECONDS;
  } else if (digits.size() > 6) {
    point = arr.size() - 6;
    suffix = "ms";
    unit = kj::MILLISECONDS;
  } else if (digits.size() > 3) {
    point = arr.size() - 3;
    suffix = "μs";
    unit = kj::MICROSECONDS;
  } else {
    point = arr.size();
    suffix = "ns";
    unit = kj::NANOSECONDS;
  }

  CappedArray<char, _::TIME_STR_LEN> result;
  char* begin = result.begin();
  char* end;
  if (negative) {
    *begin++ = '-';
  }
  if (d % unit == 0 * kj::NANOSECONDS) {
    end = _::fillLimited(begin, result.end(), arr.first(point), suffix);
  } else {
    while (arr.back() == '0') {
      arr = arr.first(arr.size() - 1);
    }
    KJ_DASSERT(arr.size() > point);
    end = _::fillLimited(begin, result.end(), arr.first(point), "."_kj,
        arr.slice(point, arr.size()), suffix);
  }
  result.setSize(end - result.begin());
  return result;
}